

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O3

double __thiscall fasttext::Meter::log(Meter *this,double __x)

{
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *this_00;
  uint64_t *puVar1;
  float *__k;
  float *pfVar2;
  undefined1 auVar3 [16];
  long in_RAX;
  mapped_type *pmVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  undefined8 *in_RDX;
  key_type *pkVar6;
  ulong *in_RSI;
  const_iterator __begin1;
  float *pfVar7;
  const_iterator __end1;
  int *label;
  key_type *__k_00;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [64];
  undefined1 extraout_var [60];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  real gold;
  real score;
  undefined8 local_38;
  
  this->nexamples_ = this->nexamples_ + 1;
  __k_00 = (key_type *)*in_RSI;
  pkVar6 = (key_type *)in_RSI[1];
  pfVar7 = (float *)*in_RDX;
  pfVar2 = (float *)in_RDX[1];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = pfVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = pkVar6;
  auVar3 = vpunpcklqdq_avx(auVar11,auVar8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = pfVar7;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = __k_00;
  auVar8 = vpunpcklqdq_avx(auVar13,auVar12);
  auVar3 = vpsubq_avx(auVar3,auVar8);
  auVar8 = vpsravq_avx512vl(auVar3,_DAT_0013ad90);
  auVar3._0_8_ = (this->metrics_).gold;
  auVar3._8_8_ = (this->metrics_).predicted;
  auVar3 = vpaddq_avx(auVar8,auVar3);
  auVar10 = ZEXT1664(auVar3);
  (this->metrics_).gold = auVar3._0_8_;
  (this->metrics_).predicted = auVar3._8_8_;
  local_38 = in_RAX;
  if (pfVar7 != pfVar2) {
    this_00 = &this->labelMetrics_;
    do {
      __k = pfVar7 + 1;
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)__k);
      pmVar4->predicted = pmVar4->predicted + 1;
      auVar10._0_4_ = expf(*pfVar7);
      auVar10._4_60_ = extraout_var;
      local_38 = (ulong)(uint)auVar10._0_4_ << 0x20;
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (*in_RSI,in_RSI[1],__k);
      if (_Var5._M_current != (int *)in_RSI[1]) {
        pmVar4 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,(key_type *)__k);
        pmVar4->predictedGold = pmVar4->predictedGold + 1;
        puVar1 = &(this->metrics_).predictedGold;
        *puVar1 = *puVar1 + 1;
        local_38 = CONCAT44(local_38._4_4_,0x3f800000);
      }
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)__k);
      std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
      emplace_back<float&,float&>
                ((vector<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)
                 &pmVar4->scoreVsTrue,(float *)((long)&local_38 + 4),(float *)&local_38);
      pfVar7 = pfVar7 + 2;
    } while (pfVar7 != pfVar2);
    __k_00 = (key_type *)*in_RSI;
    pkVar6 = (key_type *)in_RSI[1];
  }
  dVar9 = auVar10._0_8_;
  if (__k_00 != pkVar6) {
    do {
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->labelMetrics_,__k_00);
      dVar9 = auVar10._0_8_;
      pmVar4->gold = pmVar4->gold + 1;
      __k_00 = __k_00 + 1;
    } while (__k_00 != pkVar6);
  }
  return dVar9;
}

Assistant:

void Meter::log(
    const std::vector<int32_t>& labels,
    const Predictions& predictions) {
  nexamples_++;
  metrics_.gold += labels.size();
  metrics_.predicted += predictions.size();

  for (const auto& prediction : predictions) {
    labelMetrics_[prediction.second].predicted++;

    real score = std::exp(prediction.first);
    real gold = 0.0;
    if (utils::contains(labels, prediction.second)) {
      labelMetrics_[prediction.second].predictedGold++;
      metrics_.predictedGold++;
      gold = 1.0;
    }
    labelMetrics_[prediction.second].scoreVsTrue.emplace_back(score, gold);
  }

  for (const auto& label : labels) {
    labelMetrics_[label].gold++;
  }
}